

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_ARRAY::GarbageCollector
          (_Type_ARRAY *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Array *this_00;
  char cVar1;
  uint uVar2;
  Object *pOVar3;
  long in_RCX;
  uint uVar4;
  long *plVar5;
  code *pcVar6;
  
  pOVar3 = Variable::operator->(object);
  plVar5 = (long *)((long)(pOVar3->memory->arr)._M_elems + in_RCX);
  pcVar6 = (code *)caller;
  if ((caller & 1) != 0) {
    pcVar6 = *(code **)(*plVar5 + -1 + caller);
  }
  pOVar3 = Variable::operator->(object);
  cVar1 = (*pcVar6)(plVar5,pOVar3->ID);
  if (cVar1 == '\0') {
    pOVar3 = Variable::operator->(object);
    this_00 = (Array *)pOVar3->data;
    uVar2 = Array::UnamedCount(this_00);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      Array::ConstantGet((Array *)&stack0xffffffffffffffc0,(uint)this_00);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffc0,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
    }
    uVar2 = Array::NamedCount(this_00);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      Array::GetNamedVariable((Array *)&stack0xffffffffffffffc0,(uint)this_00);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffc0,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Array& obj = object->GetData<Array>();
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++)
        obj.ConstantGet(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++)
        obj.GetNamedVariable(i).GarbageCollector(caller);
}